

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void MirrorSplitUVRow_C(uint8_t *src_uv,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  long lVar1;
  uint8_t *puVar2;
  long lVar3;
  
  lVar1 = (long)width + -1;
  puVar2 = src_uv + (int)lVar1 * 2;
  if (1 < width) {
    lVar3 = 0;
    do {
      dst_u[lVar3] = *puVar2;
      dst_u[lVar3 + 1] = puVar2[-2];
      dst_v[lVar3] = puVar2[1];
      dst_v[lVar3 + 1] = puVar2[-1];
      puVar2 = puVar2 + -4;
      lVar3 = lVar3 + 2;
    } while (lVar3 < (int)lVar1);
  }
  if ((width & 1U) != 0) {
    dst_u[lVar1] = *puVar2;
    dst_v[lVar1] = puVar2[1];
  }
  return;
}

Assistant:

void MirrorSplitUVRow_C(const uint8_t* src_uv,
                        uint8_t* dst_u,
                        uint8_t* dst_v,
                        int width) {
  int x;
  src_uv += (width - 1) << 1;
  for (x = 0; x < width - 1; x += 2) {
    dst_u[x] = src_uv[0];
    dst_u[x + 1] = src_uv[-2];
    dst_v[x] = src_uv[1];
    dst_v[x + 1] = src_uv[-2 + 1];
    src_uv -= 4;
  }
  if (width & 1) {
    dst_u[width - 1] = src_uv[0];
    dst_v[width - 1] = src_uv[1];
  }
}